

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

void ts_subtree_balance(Subtree self,SubtreePool *pool,TSLanguage *language)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  Subtree SVar3;
  Subtree *pSVar4;
  SubtreeHeapData *pSVar5;
  SubtreeHeapData *pSVar6;
  MutableSubtree self_00;
  MutableSubtree self_01;
  MutableSubtree self_02;
  bool bVar7;
  TSLanguage *pTVar8;
  uint uVar9;
  MutableSubtree *pMVar10;
  uint uVar11;
  FILE *__s;
  Subtree __nmemb;
  Subtree language_00;
  undefined4 uVar12;
  TSSymbol TVar13;
  Subtree __size;
  Subtree SVar14;
  Subtree SStack_78;
  Subtree SStack_70;
  SubtreePool *pSStack_68;
  Subtree SStack_60;
  TSSymbol local_56;
  uint local_54;
  Subtree local_50;
  Subtree local_48;
  uint local_3c;
  TSLanguage *local_38;
  
  (pool->tree_stack).size = 0;
  pTVar8 = language;
  if (((((ulong)self.ptr & 1) != 0) || (pTVar8 = language, (self.ptr)->child_count == 0)) ||
     (pTVar8 = language, (self.ptr)->ref_count != 1)) goto LAB_0012e67b;
  uVar9 = (pool->tree_stack).capacity;
  if ((pool->tree_stack).size == uVar9) {
    __nmemb = (Subtree)0x8;
    if (8 < uVar9 * 2) {
      __nmemb._4_4_ = 0;
      __nmemb._0_4_ = uVar9 * 2;
    }
    if (uVar9 < __nmemb._0_4_) {
      pMVar10 = (pool->tree_stack).contents;
      __size = __nmemb;
      if (pMVar10 == (MutableSubtree *)0x0) {
LAB_0012e645:
        language_00 = (Subtree)0x8;
        SStack_60 = (Subtree)0x12e652;
        pMVar10 = (MutableSubtree *)calloc((size_t)__size,8);
        if (pMVar10 == (MutableSubtree *)0x0) {
LAB_0012e9cb:
          SStack_60.ptr = (SubtreeHeapData *)ts_subtree_print_dot_graph;
          ts_subtree_balance_cold_2();
          SStack_78 = __size;
          SStack_70 = __nmemb;
          pSStack_68 = pool;
          SStack_60 = self;
          fwrite("digraph tree {\n",0xf,1,__s);
          fwrite("edge [arrowhead=none]\n",0x16,1,__s);
          ts_subtree__print_dot_graph(&SStack_78,0,(TSLanguage *)language_00.ptr,0,(FILE *)__s);
          fwrite("}\n",2,1,__s);
          return;
        }
      }
      else {
        __size.data = __nmemb.data << 3;
        SStack_60 = (Subtree)0x12e638;
        pMVar10 = (MutableSubtree *)realloc(pMVar10,(size_t)__size);
        if (pMVar10 == (MutableSubtree *)0x0) {
          SStack_60 = (Subtree)0x12e645;
          ts_subtree_balance_cold_1();
          goto LAB_0012e645;
        }
      }
      (pool->tree_stack).contents = pMVar10;
      (pool->tree_stack).capacity = __nmemb._0_4_;
    }
  }
  uVar9 = (pool->tree_stack).size;
  (pool->tree_stack).size = uVar9 + 1;
  (pool->tree_stack).contents[uVar9] = (MutableSubtree)self;
  pTVar8 = language;
LAB_0012e67b:
  do {
    do {
      local_38 = pTVar8;
      uVar2 = (pool->tree_stack).size;
      if (uVar2 == 0) {
        return;
      }
      uVar9 = uVar2 - 1;
      (pool->tree_stack).size = uVar9;
      SVar3 = (Subtree)(pool->tree_stack).contents[uVar9].ptr;
      if (((SVar3.ptr)->field_17).field_0.repeat_depth != 0) {
        pSVar4 = ((SVar3.ptr)->field_17).field_0.children;
        pSVar5 = pSVar4->ptr;
        if (((((ulong)pSVar5 & 1) == 0) && (pSVar5->child_count != 0)) &&
           ((pSVar6 = pSVar4[(SVar3.ptr)->child_count - 1].ptr, ((ulong)pSVar6 & 1) == 0 &&
            (pSVar6->child_count != 0)))) {
          uVar9 = (pSVar5->field_17).field_0.repeat_depth;
          puVar1 = &(pSVar6->field_17).field_0.repeat_depth;
          __nmemb._0_4_ = uVar9 - *puVar1;
          __nmemb._4_4_ = 0;
          if ((*puVar1 <= uVar9 && __nmemb._0_4_ != 0) && (1 < (uint)__nmemb._0_4_)) {
            do {
              local_3c = __nmemb._0_4_;
              __nmemb._0_4_ = local_3c >> 1;
              __nmemb._4_4_ = 0;
              uVar12 = (pool->tree_stack).size;
              TVar13 = (SVar3.ptr)->symbol;
              SVar14 = SVar3;
              uVar9 = __nmemb._0_4_;
              while( true ) {
                self._0_4_ = uVar9 - 1;
                self._4_4_ = 0;
                if ((1 < (SVar14.ptr)->ref_count) || ((SVar14.ptr)->child_count < 2)) break;
                pSVar5 = (*(Subtree **)&(SVar14.ptr)->field_17)->ptr;
                bVar7 = true;
                if ((((((ulong)pSVar5 & 1) == 0) &&
                     (((1 < pSVar5->child_count && (pSVar5->ref_count < 2)) &&
                      (pSVar5->symbol == TVar13)))) &&
                    (((__size = (Subtree)(*(Subtree **)&pSVar5->field_17)->ptr,
                      ((ulong)__size.ptr & 1) == 0 && (1 < (__size.ptr)->child_count)) &&
                     ((__size.ptr)->ref_count < 2)))) && ((__size.ptr)->symbol == TVar13)) {
                  (*(Subtree **)&(SVar14.ptr)->field_17)->ptr = (SubtreeHeapData *)__size;
                  *(pSVar5->field_17).field_0.children =
                       ((__size.ptr)->field_17).field_0.children[(__size.ptr)->child_count - 1];
                  ((__size.ptr)->field_17).field_0.children[(__size.ptr)->child_count - 1].ptr =
                       pSVar5;
                  uVar9 = (pool->tree_stack).capacity;
                  if ((pool->tree_stack).size == uVar9) {
                    uVar11 = uVar9 * 2;
                    if (uVar11 < 9) {
                      uVar11 = 8;
                    }
                    if (uVar9 < uVar11) {
                      local_50._0_4_ = uVar12;
                      pMVar10 = (pool->tree_stack).contents;
                      local_48._4_4_ = 0;
                      local_48._0_4_ = uVar11;
                      local_56 = TVar13;
                      local_54 = uVar11;
                      if (pMVar10 == (MutableSubtree *)0x0) {
                        language_00 = (Subtree)0x8;
                        SStack_60 = (Subtree)0x12e82e;
                        pMVar10 = (MutableSubtree *)calloc((size_t)local_48,8);
                        if (pMVar10 == (MutableSubtree *)0x0) goto LAB_0012e9c1;
                      }
                      else {
                        language_00.data = local_48.data << 3;
                        SStack_60 = (Subtree)0x12e7f7;
                        local_48.ptr = language_00.ptr;
                        pMVar10 = (MutableSubtree *)realloc(pMVar10,(size_t)language_00);
                        if (pMVar10 == (MutableSubtree *)0x0) goto LAB_0012e9b7;
                      }
                      (pool->tree_stack).contents = pMVar10;
                      (pool->tree_stack).capacity = local_54;
                      uVar12 = local_50._0_4_;
                      TVar13 = local_56;
                    }
                  }
                  uVar9 = (pool->tree_stack).size;
                  (pool->tree_stack).size = uVar9 + 1;
                  (pool->tree_stack).contents[uVar9].ptr = (SubtreeHeapData *)SVar14;
                  bVar7 = false;
                  SVar14 = __size;
                }
                if ((bVar7) || (uVar9 = self._0_4_, self._0_4_ == 0)) break;
              }
              pTVar8 = local_38;
              uVar9 = (pool->tree_stack).size;
              while (local_50 = __nmemb, (uint)uVar12 < uVar9) {
                (pool->tree_stack).size = uVar9 - 1;
                self_00 = (MutableSubtree)(pool->tree_stack).contents[uVar9 - 1].ptr;
                self_01 = (MutableSubtree)(((self_00.ptr)->field_17).field_0.children)->ptr;
                self_02 = (MutableSubtree)
                          ((self_01.ptr)->field_17).field_0.children[(self_01.ptr)->child_count - 1]
                          .ptr;
                SStack_60 = (Subtree)0x12e8ad;
                ts_subtree_set_children
                          (self_02,((self_02.ptr)->field_17).field_0.children,
                           (self_02.ptr)->child_count,pTVar8);
                SStack_60 = (Subtree)0x12e8c2;
                ts_subtree_set_children
                          (self_01,((self_01.ptr)->field_17).field_0.children,
                           (self_01.ptr)->child_count,pTVar8);
                SStack_60 = (Subtree)0x12e8d5;
                ts_subtree_set_children
                          (self_00,((self_00.ptr)->field_17).field_0.children,
                           (self_00.ptr)->child_count,pTVar8);
                __nmemb = local_50;
                uVar9 = (pool->tree_stack).size;
              }
            } while (3 < local_3c);
          }
        }
      }
      pTVar8 = local_38;
    } while ((SVar3.ptr)->child_count == 0);
    __size.ptr = (SubtreeHeapData *)0x0;
    do {
      pSVar5 = ((SVar3.ptr)->field_17).field_0.children[(long)__size].ptr;
      if (((((ulong)pSVar5 & 1) == 0) && (pSVar5->child_count != 0)) && (pSVar5->ref_count == 1)) {
        uVar9 = (pool->tree_stack).capacity;
        if ((pool->tree_stack).size == uVar9) {
          uVar11 = uVar9 * 2;
          if (uVar9 * 2 < 9) {
            uVar11 = 8;
          }
          __nmemb._4_4_ = 0;
          __nmemb._0_4_ = uVar11;
          if (uVar9 < uVar11) {
            pMVar10 = (pool->tree_stack).contents;
            if (pMVar10 == (MutableSubtree *)0x0) {
              language_00 = (Subtree)0x8;
              SStack_60 = (Subtree)0x12e964;
              pMVar10 = (MutableSubtree *)calloc((size_t)__nmemb,8);
              self = __nmemb;
              if (pMVar10 != (MutableSubtree *)0x0) goto LAB_0012e969;
            }
            else {
              self.data = __nmemb.data << 3;
              SStack_60 = (Subtree)0x12e950;
              language_00.ptr = self.ptr;
              pMVar10 = (MutableSubtree *)realloc(pMVar10,(size_t)self);
              if (pMVar10 != (MutableSubtree *)0x0) {
LAB_0012e969:
                (pool->tree_stack).contents = pMVar10;
                (pool->tree_stack).capacity = uVar11;
                goto LAB_0012e971;
              }
              SStack_60 = (Subtree)0x12e9af;
              ts_subtree_balance_cold_5();
            }
            SStack_60 = (Subtree)0x12e9b7;
            ts_subtree_balance_cold_6();
LAB_0012e9b7:
            SStack_60 = (Subtree)0x12e9c1;
            ts_subtree_balance_cold_3();
LAB_0012e9c1:
            SStack_60 = (Subtree)0x12e9cb;
            ts_subtree_balance_cold_4();
            goto LAB_0012e9cb;
          }
        }
LAB_0012e971:
        uVar9 = (pool->tree_stack).size;
        (pool->tree_stack).size = uVar9 + 1;
        (pool->tree_stack).contents[uVar9].ptr = pSVar5;
      }
      __size.ptr = (SubtreeHeapData *)((long)&(__size.ptr)->ref_count + 1);
      pTVar8 = local_38;
    } while (__size.ptr < (TSLanguage *)(ulong)(SVar3.ptr)->child_count);
  } while( true );
}

Assistant:

void ts_subtree_balance(Subtree self, SubtreePool *pool, const TSLanguage *language) {
  array_clear(&pool->tree_stack);

  if (ts_subtree_child_count(self) > 0 && self.ptr->ref_count == 1) {
    array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(self));
  }

  while (pool->tree_stack.size > 0) {
    MutableSubtree tree = array_pop(&pool->tree_stack);

    if (tree.ptr->repeat_depth > 0) {
      Subtree child1 = tree.ptr->children[0];
      Subtree child2 = tree.ptr->children[tree.ptr->child_count - 1];
      if (
        ts_subtree_child_count(child1) > 0 &&
        ts_subtree_child_count(child2) > 0 &&
        child1.ptr->repeat_depth > child2.ptr->repeat_depth
      ) {
        unsigned n = child1.ptr->repeat_depth - child2.ptr->repeat_depth;
        for (unsigned i = n / 2; i > 0; i /= 2) {
          ts_subtree__compress(tree, i, language, &pool->tree_stack);
          n -= i;
        }
      }
    }

    for (uint32_t i = 0; i < tree.ptr->child_count; i++) {
      Subtree child = tree.ptr->children[i];
      if (ts_subtree_child_count(child) > 0 && child.ptr->ref_count == 1) {
        array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(child));
      }
    }
  }
}